

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConcatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Rep *pRVar2;
  key_type *__k;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  LayerUnion LVar6;
  LogMessage *pLVar7;
  iterator iVar8;
  mapped_type_conflict1 *pmVar9;
  long *plVar10;
  size_type *psVar11;
  long lVar12;
  long lVar13;
  void **ppvVar14;
  string err;
  pointer local_120;
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  NeuralNetworkSpecValidator *local_f8;
  string local_f0;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [44];
  mapped_type_conflict1 local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = this;
  Result::Result((Result *)&local_120);
  validateInputCount((Result *)local_d0,layer,2,-1);
  local_120 = (pointer)local_d0;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
  pcVar4 = local_c0 + 8;
  if (local_c8._M_p != pcVar4) {
    operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
  }
  bVar5 = Result::good((Result *)&local_120);
  if (bVar5) {
    validateOutputCount((Result *)local_d0,layer,1,1);
    local_120 = (pointer)local_d0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
    if (local_c8._M_p != pcVar4) {
      operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
    }
  }
  bVar5 = Result::good((Result *)&local_120);
  if ((bVar5) && (local_f8->ndArrayInterpretation == true)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Concat","");
    this_00 = &local_f8->blobNameToRank;
    validateInputOutputRankEquality((Result *)local_d0,layer,&local_70,this_00);
    local_120 = (pointer)local_d0;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
    if (local_c8._M_p != pcVar4) {
      operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)&local_120);
    if (bVar5) {
      if (layer->_oneof_case_[0] == 0x140) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.concat_ = Specification::ConcatLayerParams::default_instance();
      }
      if ((LVar6.mvn_)->acrosschannels_ == true) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Concat","");
        validateRankCount((Result *)local_d0,layer,&local_f0,5,-1,this_00);
        local_120 = (pointer)local_d0;
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
        if (local_c8._M_p != pcVar4) {
          operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good((Result *)&local_120);
      }
      else {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Concat","");
        validateRankCount((Result *)local_d0,layer,&local_f0,3,-1,this_00);
        local_120 = (pointer)local_d0;
        std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
        if (local_c8._M_p != pcVar4) {
          operator_delete(local_c8._M_p,local_c0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = Result::good((Result *)&local_120);
      }
      if (bVar5 != false) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_d0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d0);
        }
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&this_00->_M_t,
                       (key_type *)((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        local_f8 = (NeuralNetworkSpecValidator *)
                   &(local_f8->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((NeuralNetworkSpecValidator *)iVar8._M_node != local_f8) {
          if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar7 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_d0,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_f0,pLVar7);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d0);
          }
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(this_00,(key_type *)
                                ((layer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
          pRVar2 = (layer->input_).super_RepeatedPtrFieldBase.rep_;
          ppvVar14 = pRVar2->elements;
          if (pRVar2 == (Rep *)0x0) {
            ppvVar14 = (void **)0x0;
          }
          lVar13 = (long)(layer->input_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar13 != 0) {
            local_94 = *pmVar9;
            lVar12 = 0;
            do {
              __k = *(key_type **)((long)ppvVar14 + lVar12);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&this_00->_M_t,__k);
              if (((NeuralNetworkSpecValidator *)iVar8._M_node != local_f8) &&
                 (pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(this_00,__k), local_94 != *pmVar9)) {
                local_c8._M_p = (pointer)0x0;
                local_c0[0] = '\0';
                psVar3 = (layer->name_).ptr_;
                pcVar4 = (psVar3->_M_dataplus)._M_p;
                local_d0 = (undefined1  [8])local_c0;
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_90,pcVar4,pcVar4 + psVar3->_M_string_length);
                std::operator+(&local_50,"Layer \'",&local_90);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar11 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_f0.field_2._M_allocated_capacity = *psVar11;
                  local_f0.field_2._8_8_ = plVar10[3];
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                }
                else {
                  local_f0.field_2._M_allocated_capacity = *psVar11;
                  local_f0._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_f0._M_string_length = plVar10[1];
                *plVar10 = (long)psVar11;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d0);
                if (local_d0 != (undefined1  [8])local_c0) {
                  operator_delete((void *)local_d0,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_p == &local_108) {
                  return __return_storage_ptr__;
                }
                operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
                return __return_storage_ptr__;
              }
              lVar12 = lVar12 + 8;
            } while (lVar13 * 8 != lVar12);
          }
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_120;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p == &local_108) {
    paVar1->_M_allocated_capacity = local_108._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_108._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_118._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_108._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_110;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConcatLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Concat", blobNameToRank);
        if (!r.good()) {return r;}
        if (layer.concat().sequenceconcat()) {
            r = validateRankCount(layer, "Concat", 5, -1, blobNameToRank);
            if (!r.good()) {return r;}
        } else {
            r = validateRankCount(layer, "Concat", 3, -1, blobNameToRank);
            if (!r.good()) {return r;}
        }

        // check that all inputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.input(0));
        } else {
            return r;
        }

        for (const auto& input : layer.input()) {
            if (blobNameToRank.find(input) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(input)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Concat' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}